

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::gather_modeling_interactive(void)

{
  allocator<char> local_159;
  string local_158;
  int local_138;
  allocator<char> local_131;
  int choice;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  byte local_9;
  bool answered;
  
  local_9 = 0;
  while ((local_9 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"What would you like to do?",&local_31);
    print_ln(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68," 1 - Append one 2D geofile to another.",&local_69);
    print_ln(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90," 2 - Merge two geo files.",&local_91);
    print_ln(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8," 3 - Translate entire geo file.",&local_b9);
    print_ln(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0," 4 - Rotate entire geo file.",&local_e1);
    print_ln(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108," 5 - Scale entire geo file.",&local_109);
    print_ln(&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    skip_ln();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&choice,"Please enter a number followed by return:",&local_131);
    print_ln((string *)&choice);
    std::__cxx11::string::~string((string *)&choice);
    std::allocator<char>::~allocator(&local_131);
    local_138 = get_choice();
    switch(local_138) {
    case 1:
      gather_append_interactive();
      local_9 = 1;
      break;
    case 2:
      gather_merge_interactive();
      local_9 = 1;
      break;
    case 3:
      gather_translate_interactive();
      local_9 = 1;
      break;
    case 4:
      gather_rotate_interactive();
      local_9 = 1;
      break;
    case 5:
      gather_scale_interactive();
      local_9 = 1;
      break;
    default:
      clear_screen();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"Unrecognized input",&local_159);
      print_ln(&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
  }
  return;
}

Assistant:

void UI::gather_modeling_interactive()
{
    bool answered = false;
    while (answered == false)
    {
        print_ln("What would you like to do?");
        print_ln(" 1 - Append one 2D geofile to another.");
        print_ln(" 2 - Merge two geo files.");
        print_ln(" 3 - Translate entire geo file.");
        print_ln(" 4 - Rotate entire geo file.");
        print_ln(" 5 - Scale entire geo file.");
        skip_ln();
        print_ln("Please enter a number followed by return:");
        int choice = get_choice();
        switch (choice)
        {
        case 1:
            gather_append_interactive();
            answered = true;
            break;
        case 2:
            gather_merge_interactive();
            answered = true;
            break;
        case 3:
            gather_translate_interactive();
            answered = true;
            break;
        case 4:
            gather_rotate_interactive();
            answered = true;
            break;
        case 5:
            gather_scale_interactive();
            answered = true;
            break;
        default:
            clear_screen();
            print_ln("Unrecognized input");
            break;
        }
    }
}